

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

SequenceSymbol *
slang::ast::SequenceSymbol::fromSyntax(Scope *scope,SequenceDeclarationSyntax *syntax)

{
  Compilation *args;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  int iVar1;
  SequenceSymbol *this;
  undefined4 extraout_var;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX_01;
  SmallVector<const_slang::ast::AssertionPortSymbol_*,_5UL> ports;
  SourceLocation local_70;
  SmallVectorBase<const_slang::ast::AssertionPortSymbol_*> local_68 [2];
  
  args = scope->compilation;
  local_68[0]._0_16_ = (undefined1  [16])parsing::Token::valueText(&syntax->name);
  local_70 = parsing::Token::location(&syntax->name);
  this = BumpAllocator::
         emplace<slang::ast::SequenceSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                   (&args->super_BumpAllocator,args,
                    (basic_string_view<char,_std::char_traits<char>_> *)local_68,&local_70);
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  syntax_00._M_ptr =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_00._M_extent._M_extent_value =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  Symbol::setAttributes(&this->super_Symbol,scope,syntax_00);
  local_68[0].len = 0;
  local_68[0].data_ = (pointer)((long)local_68 + 0x18U);
  local_68[0].cap = 5;
  src = extraout_RDX;
  if (syntax->portList != (AssertionItemPortListSyntax *)0x0) {
    AssertionPortSymbol::buildPorts(&this->super_Scope,syntax->portList,local_68);
    src = extraout_RDX_00;
  }
  iVar1 = SmallVectorBase<const_slang::ast::AssertionPortSymbol_*>::copy
                    (local_68,(EVP_PKEY_CTX *)args,src);
  (this->ports)._M_ptr = (pointer)CONCAT44(extraout_var,iVar1);
  (this->ports)._M_extent._M_extent_value = extraout_RDX_01;
  if (local_68[0].data_ != (pointer)((long)local_68 + 0x18U)) {
    operator_delete(local_68[0].data_);
  }
  return this;
}

Assistant:

SequenceSymbol& SequenceSymbol::fromSyntax(const Scope& scope,
                                           const SequenceDeclarationSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto result = comp.emplace<SequenceSymbol>(comp, syntax.name.valueText(),
                                               syntax.name.location());
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);

    SmallVector<const AssertionPortSymbol*> ports;
    if (syntax.portList)
        AssertionPortSymbol::buildPorts(*result, *syntax.portList, ports);
    result->ports = ports.copy(comp);

    return *result;
}